

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_4chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  uint8_t *puVar14;
  float fVar15;
  
  pvVar13 = decode->unpacked_buffer;
  peVar3 = decode->channels;
  iVar1 = peVar3->width;
  lVar6 = (long)iVar1;
  iVar9 = (decode->chunk).height;
  iVar2 = peVar3->user_line_stride;
  puVar14 = (peVar3->field_12).decode_to_ptr;
  lVar5 = (long)(iVar1 * 8);
  iVar10 = 0;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  pvVar8 = (void *)((long)pvVar13 + lVar6 * 2);
  pvVar12 = (void *)((long)pvVar13 + lVar6 * 4);
  pvVar11 = (void *)(lVar6 * 6 + (long)pvVar13);
  for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
    for (uVar7 = 0; (uint)(iVar4 * 2) != uVar7; uVar7 = uVar7 + 2) {
      fVar15 = half_to_float(*(uint16_t *)((long)pvVar11 + uVar7));
      *(float *)(puVar14 + uVar7 * 8) = fVar15;
      fVar15 = half_to_float(*(uint16_t *)((long)pvVar12 + uVar7));
      *(float *)(puVar14 + uVar7 * 8 + 4) = fVar15;
      fVar15 = half_to_float(*(uint16_t *)((long)pvVar8 + uVar7));
      *(float *)(puVar14 + uVar7 * 8 + 8) = fVar15;
      fVar15 = half_to_float(*(uint16_t *)((long)pvVar13 + uVar7));
      *(float *)(puVar14 + uVar7 * 8 + 0xc) = fVar15;
    }
    pvVar13 = (void *)((long)pvVar13 + lVar5);
    puVar14 = puVar14 + iVar2;
    pvVar8 = (void *)((long)pvVar8 + lVar5);
    pvVar12 = (void *)((long)pvVar12 + lVar5);
    pvVar11 = (void *)((long)pvVar11 + lVar5);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;
        in0        = (const uint16_t*) srcbuffer;
        in1        = in0 + w;
        in2        = in1 + w;
        in3        = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in3[x]));
            out[1] = half_to_float (one_to_native16 (in2[x]));
            out[2] = half_to_float (one_to_native16 (in1[x]));
            out[3] = half_to_float (one_to_native16 (in0[x]));
            out += 4;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}